

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O3

int Cec_ManSimAnalyzeOutputs(Cec_ManSim_t *p)

{
  uint *puVar1;
  uint *p1;
  int iVar2;
  int iVar3;
  uint uVar4;
  void **ppvVar5;
  int iVar6;
  long lVar7;
  
  if (p->pPars->fCheckMiter == 0) {
    uVar4 = 0;
  }
  else {
    if (p->vCoSimInfo == (Vec_Ptr_t *)0x0) {
      __assert_fail("p->vCoSimInfo != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                    ,0x24e,"int Cec_ManSimAnalyzeOutputs(Cec_ManSim_t *)");
    }
    iVar6 = p->pAig->nRegs;
    iVar3 = p->pAig->vCos->nSize;
    if (p->pPars->fDualOut == 0) {
      if (iVar6 < iVar3) {
        lVar7 = 0;
        do {
          if (p->vCoSimInfo->nSize <= lVar7) goto LAB_005cb2e3;
          puVar1 = (uint *)p->vCoSimInfo->pArray[lVar7];
          iVar6 = p->nWords;
          iVar3 = Cec_ManSimCompareConst(puVar1,iVar6);
          if (iVar3 == 0) {
            if (p->iOut == -1) {
              p->iOut = (int)lVar7;
              iVar6 = Cec_ManSimCompareConstFirstBit(puVar1,iVar6);
              Cec_ManSimSavePattern(p,iVar6);
            }
            ppvVar5 = p->pCexes;
            if (ppvVar5 == (void **)0x0) {
              ppvVar5 = (void **)calloc((long)p->pAig->vCos->nSize - (long)p->pAig->nRegs,8);
              p->pCexes = ppvVar5;
            }
            if (ppvVar5[lVar7] == (void *)0x0) {
              p->nOuts = p->nOuts + 1;
              ppvVar5[lVar7] = (void *)0x1;
            }
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < (long)p->pAig->vCos->nSize - (long)p->pAig->nRegs);
      }
    }
    else {
      if ((iVar3 - iVar6 & 1U) != 0) {
        __assert_fail("(Gia_ManPoNum(p->pAig) & 1) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                      ,0x252,"int Cec_ManSimAnalyzeOutputs(Cec_ManSim_t *)");
      }
      if (iVar6 < iVar3) {
        iVar6 = 0;
        lVar7 = 0;
        do {
          uVar4 = p->vCoSimInfo->nSize;
          if (((int)uVar4 <= lVar7) || ((ulong)uVar4 <= lVar7 + 1U)) {
LAB_005cb2e3:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          ppvVar5 = p->vCoSimInfo->pArray;
          puVar1 = (uint *)ppvVar5[lVar7];
          p1 = (uint *)ppvVar5[lVar7 + 1];
          iVar3 = p->nWords;
          iVar2 = Cec_ManSimCompareEqual(puVar1,p1,iVar3);
          if (iVar2 == 0) {
            if (p->iOut == -1) {
              p->iOut = iVar6;
              iVar3 = Cec_ManSimCompareEqualFirstBit(puVar1,p1,iVar3);
              Cec_ManSimSavePattern(p,iVar3);
            }
            ppvVar5 = p->pCexes;
            if (ppvVar5 == (void **)0x0) {
              ppvVar5 = (void **)calloc((long)((p->pAig->vCos->nSize - p->pAig->nRegs) / 2),8);
              p->pCexes = ppvVar5;
            }
            if (*(long *)((long)ppvVar5 + lVar7 * 4) == 0) {
              p->nOuts = p->nOuts + 1;
              *(undefined8 *)((long)ppvVar5 + lVar7 * 4) = 1;
            }
          }
          iVar6 = iVar6 + 1;
          lVar7 = lVar7 + 2;
        } while ((int)lVar7 < p->pAig->vCos->nSize - p->pAig->nRegs);
      }
    }
    uVar4 = (uint)(p->pCexes != (void **)0x0);
  }
  return uVar4;
}

Assistant:

int Cec_ManSimAnalyzeOutputs( Cec_ManSim_t * p )
{
    unsigned * pInfo, * pInfo2;
    int i;
    if ( !p->pPars->fCheckMiter )
        return 0;
    assert( p->vCoSimInfo != NULL );
    // compare outputs with 0
    if ( p->pPars->fDualOut )
    {
        assert( (Gia_ManPoNum(p->pAig) & 1) == 0 );
        for ( i = 0; i < Gia_ManPoNum(p->pAig); i++ )
        {
            pInfo  = (unsigned *)Vec_PtrEntry( p->vCoSimInfo, i );
            pInfo2 = (unsigned *)Vec_PtrEntry( p->vCoSimInfo, ++i );
            if ( !Cec_ManSimCompareEqual( pInfo, pInfo2, p->nWords ) )
            {
                if ( p->iOut == -1 )
                {
                    p->iOut = i/2;
                    Cec_ManSimSavePattern( p, Cec_ManSimCompareEqualFirstBit(pInfo, pInfo2, p->nWords) );
                }
                if ( p->pCexes == NULL )
                    p->pCexes = ABC_CALLOC( void *, Gia_ManPoNum(p->pAig)/2 );
                if ( p->pCexes[i/2] == NULL )
                {
                    p->nOuts++;
                    p->pCexes[i/2] = (void *)1;
                }
            }
        }
    }
    else
    {
        for ( i = 0; i < Gia_ManPoNum(p->pAig); i++ )
        {
            pInfo = (unsigned *)Vec_PtrEntry( p->vCoSimInfo, i );
            if ( !Cec_ManSimCompareConst( pInfo, p->nWords ) )
            {
                if ( p->iOut == -1 )
                {
                    p->iOut = i;
                    Cec_ManSimSavePattern( p, Cec_ManSimCompareConstFirstBit(pInfo, p->nWords) );
                }
                if ( p->pCexes == NULL )
                    p->pCexes = ABC_CALLOC( void *, Gia_ManPoNum(p->pAig) );
                if ( p->pCexes[i] == NULL )
                {
                    p->nOuts++;
                    p->pCexes[i] = (void *)1;
                }
            }
        }
    }
    return p->pCexes != NULL;
}